

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::Append(Lexer *this,Lexeme *stream,uint count)

{
  uint uVar1;
  uint uVar2;
  uint oldSize;
  uint count_local;
  Lexeme *stream_local;
  Lexer *this_local;
  
  uVar1 = SmallArray<Lexeme,_32U>::size(&this->lexems);
  uVar2 = SmallArray<Lexeme,_32U>::size(&this->lexems);
  SmallArray<Lexeme,_32U>::resize(&this->lexems,uVar2 + count);
  memcpy((this->lexems).data + uVar1,stream,(ulong)count << 5);
  return;
}

Assistant:

void Lexer::Append(Lexeme* stream, unsigned count)
{
	unsigned oldSize = lexems.size();
	lexems.resize(lexems.size() + count);
	memcpy(&lexems.data[oldSize], stream, count * sizeof(Lexeme));
}